

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O2

char16 __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToCanonical
          (CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this,char16 c)

{
  Char CVar1;
  char16 cVar2;
  unsigned_long uVar3;
  
  uVar3 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Get(&this->toEquivs,c);
  if (uVar3 != 0xffffffffffffffff) {
    CVar1 = Chars<char16_t>::UTC((uint)uVar3 & 0xffff);
    return CVar1;
  }
  cVar2 = CaseMapper<UnifiedRegex::TrivialCaseMapper>::ToCanonical(this->fallbackMapper,c);
  return cVar2;
}

Assistant:

inline char16 ToCanonical(char16 c) const
        {
            uint64 r = toEquivs.Get(c);
            return r == EQUIV_MISSING ? fallbackMapper->ToCanonical(c) : Chars<char16>::UTC(r & 0xffff);
        }